

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_bool(char *p,bool *value)

{
  int iVar1;
  undefined1 *in_RSI;
  uint *in_RDI;
  uint v;
  char *q;
  int local_24;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  *in_RSI = 0;
  iVar1 = strcasecmp((char *)in_RDI,"false");
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = strcasecmp((char *)in_RDI,"true");
    if (iVar1 == 0) {
      *in_RSI = 1;
      bVar2 = true;
    }
    else {
      bVar2 = string_to_uint((char **)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             in_RDI);
      if (bVar2) {
        if (local_24 == 0) {
          return true;
        }
        if (local_24 == 1) {
          *in_RSI = 1;
          return true;
        }
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool string_to_bool(const char* p, bool& value) {
  CRNLIB_ASSERT(p);

  value = false;

  if (crnlib_stricmp(p, "false") == 0)
    return true;

  if (crnlib_stricmp(p, "true") == 0) {
    value = true;
    return true;
  }

  const char* q = p;
  uint v;
  if (string_to_uint(q, v)) {
    if (!v)
      return true;
    else if (v == 1) {
      value = true;
      return true;
    }
  }

  return false;
}